

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

int __thiscall ON_ClippingRegion::InClipPlaneRegion(ON_ClippingRegion *this,int count,ON_3fPoint *p)

{
  double *pdVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  
  iVar6 = 0;
  if (p != (ON_3fPoint *)0x0 && 0 < count) {
    if (0 < this->m_clip_plane_count) {
      uVar4 = 0;
      uVar3 = 0xffffffff;
      do {
        bVar8 = count == 0;
        count = count + -1;
        if (bVar8) {
          if (uVar3 == 0) {
            return (uVar4 == 0) + 1;
          }
          return 0;
        }
        uVar5 = 0;
        uVar2 = 0x40;
        pdVar1 = (double *)&this->field_0x110;
        iVar6 = this->m_clip_plane_count;
        while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
          uVar7 = uVar2;
          if (-this->m_clip_plane_tolerance <=
              pdVar1[2] * (double)p->z + *pdVar1 * (double)p->x + pdVar1[1] * (double)p->y +
              pdVar1[3]) {
            uVar7 = 0;
          }
          uVar5 = uVar5 | uVar7;
          uVar2 = uVar2 * 2;
          pdVar1 = pdVar1 + 4;
        }
        uVar4 = uVar4 | uVar5;
        uVar3 = uVar3 & uVar5;
        p = p + 1;
      } while (uVar3 != 0 || uVar4 == 0);
      return 1;
    }
    iVar6 = 2;
  }
  return iVar6;
}

Assistant:

int ON_ClippingRegion::InClipPlaneRegion( 
  int count, 
  const ON_3fPoint* p
  ) const
{
  const ON_PlaneEquation* cpeqn;
  const float* cv;
  double x;
  unsigned int out, all_out, some_out, cpbit;
  int i, j;

  // 14 May 2012 Dale Lear
  //   Fix http://dev.mcneel.com/bugtrack/?q=102481
  //   Picking hatches that are coplanar with clipping planes.
  //   The "fix" was to set clipping_plane_tolerance = same
  //   tolerance the display code uses.  Before the fix,
  //   0.0 was used as the clipping_plane_tolerance.
  const double clip_plane_tolerance = ClipPlaneTolerance();

  if ( count <= 0 || !p )
    return 0;

  if ( m_clip_plane_count <= 0 )
    return 2;

  some_out = 0;
  all_out  = 0xFFFFFFFF;
  cv = &p[0].x;
  for ( i = count; i--; cv += 3 )
  {
    out = 0;
    //if ( m_clip_plane_count )
    {
      cpbit = 0x40;
      cpeqn = m_clip_plane;
      j = m_clip_plane_count;
      while (j--)
      {
        x = cpeqn->x*cv[0] + cpeqn->y*cv[1] + cpeqn->z*cv[2] + cpeqn->d;
        if ( x < -clip_plane_tolerance )
          out |= cpbit;
        cpbit <<= 1;
        cpeqn++;
      }
    }
    some_out |= out;
    all_out  &= out;
    if ( some_out && !all_out )
    {
      //  no further "out" checking is necessary
      break;
    }
  }

  if ( all_out )
    i = 0;
  else if ( some_out )
    i = 1;
  else
    i = 2;

  return i;
}